

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_start_ext(mpack_writer_t *writer,int8_t exttype,uint32_t count)

{
  _Bool _Var1;
  uint8_t *u;
  char *pcVar2;
  ulong uVar3;
  
  if (writer->version < mpack_version_current) {
    if (writer->error != mpack_ok) {
      return;
    }
    writer->error = mpack_error_bug;
    if (writer->error_fn == (mpack_writer_error_t)0x0) {
      return;
    }
    (*writer->error_fn)(writer,mpack_error_bug);
    return;
  }
  switch(count) {
  case 1:
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = -0x2c;
    break;
  case 2:
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = -0x2b;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_0010634d_caseD_3:
    if (0xff < count) {
      pcVar2 = writer->current;
      uVar3 = (long)writer->end - (long)pcVar2;
      if (0xffff < count) {
        if (uVar3 < 6) {
          _Var1 = mpack_writer_ensure(writer,6);
          if (!_Var1) {
            return;
          }
          pcVar2 = writer->current;
        }
        *pcVar2 = -0x37;
        *(uint32_t *)(pcVar2 + 1) =
             count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
        pcVar2[5] = exttype;
        writer->current = writer->current + 6;
        return;
      }
      if (uVar3 < 4) {
        _Var1 = mpack_writer_ensure(writer,4);
        if (!_Var1) {
          return;
        }
        pcVar2 = writer->current;
      }
      *pcVar2 = -0x38;
      *(ushort *)(pcVar2 + 1) = (ushort)count << 8 | (ushort)count >> 8;
      pcVar2[3] = exttype;
      writer->current = writer->current + 4;
      return;
    }
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 3) {
      _Var1 = mpack_writer_ensure(writer,3);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = -0x39;
    pcVar2[1] = (char)count;
    pcVar2[2] = exttype;
    writer->current = writer->current + 3;
    return;
  case 4:
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = -0x2a;
    break;
  case 8:
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = -0x29;
    break;
  default:
    if (count != 0x10) goto switchD_0010634d_caseD_3;
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = -0x28;
  }
  pcVar2[1] = exttype;
  writer->current = writer->current + 2;
  return;
}

Assistant:

void mpack_start_ext(mpack_writer_t* writer, int8_t exttype, uint32_t count) {
    #if MPACK_COMPATIBILITY
    if (writer->version <= mpack_version_v4) {
        mpack_break("Ext types require spec version v5 or later. This writer is in v%i mode.", (int)writer->version);
        mpack_writer_flag_error(writer, mpack_error_bug);
        return;
    }
    #endif

    mpack_writer_track_element(writer);

    if (count == 1) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext1, MPACK_TAG_SIZE_FIXEXT1, exttype);
    } else if (count == 2) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext2, MPACK_TAG_SIZE_FIXEXT2, exttype);
    } else if (count == 4) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext4, MPACK_TAG_SIZE_FIXEXT4, exttype);
    } else if (count == 8) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext8, MPACK_TAG_SIZE_FIXEXT8, exttype);
    } else if (count == 16) {
        MPACK_WRITE_ENCODED(mpack_encode_fixext16, MPACK_TAG_SIZE_FIXEXT16, exttype);
    } else if (count <= UINT8_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_ext8, MPACK_TAG_SIZE_EXT8, exttype, (uint8_t)count);
    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_ext16, MPACK_TAG_SIZE_EXT16, exttype, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_ext32, MPACK_TAG_SIZE_EXT32, exttype, (uint32_t)count);
    }

    mpack_writer_track_push(writer, mpack_type_ext, count);
}